

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O0

char * glTextureWrapModeStr(int wrapMode)

{
  char *pcStack_10;
  int wrapMode_local;
  
  if (wrapMode == 0x2901) {
    pcStack_10 = "repeat";
  }
  else if (wrapMode == 0x812d) {
    pcStack_10 = "clamp to border";
  }
  else if (wrapMode == 0x812f) {
    pcStack_10 = "clamp to edge";
  }
  else {
    if (wrapMode != 0x8370) {
      __assert_fail("false",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/utils.cpp"
                    ,0xfb,"const char *glTextureWrapModeStr(int)");
    }
    pcStack_10 = "mirrored repeat";
  }
  return pcStack_10;
}

Assistant:

const char* glTextureWrapModeStr(int wrapMode)
{
    switch (wrapMode) {
        case GL_CLAMP_TO_EDGE: return "clamp to edge";
        case GL_CLAMP_TO_BORDER: return "clamp to border";
        case GL_MIRRORED_REPEAT: return "mirrored repeat";
        case GL_REPEAT: return "repeat";
        //case GL_MIRROR_CLAMP_TO_EDGE: return "mirror clamp to edge";
    }
    assert(false);
    return "";
}